

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetMessageEntity(TgTypeParser *this,ptree *data)

{
  int iVar1;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar2;
  allocator local_91;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::make_shared<TgBot::MessageEntity>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_90,"type",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_60,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_90);
  std::__cxx11::string::operator=(*(string **)this,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_90);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_90,"offset",0x2e);
  iVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_90);
  *(int *)(*(long *)this + 0x20) = iVar1;
  std::__cxx11::string::~string((string *)&local_90);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_90,"length",0x2e);
  iVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_90);
  *(int *)(*(long *)this + 0x24) = iVar1;
  std::__cxx11::string::~string((string *)&local_90);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_90,"url",0x2e);
  std::__cxx11::string::string((string *)&local_40,"",&local_91);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_60,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_90,&local_40);
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x28),(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"user",(allocator *)&local_40);
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_60,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  std::__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x48),
             (__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
  std::__cxx11::string::~string((string *)&local_90);
  PVar2.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MessageEntity::Ptr TgTypeParser::parseJsonAndGetMessageEntity(const ptree& data) const{
    auto result(make_shared<MessageEntity>());
    result->type = data.get<string>("type");
    result->offset = data.get<int32_t>("offset");
    result->length = data.get<int32_t>("length");
    result->url = data.get<string>("url", "");
    result->user = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "user");
    return result;
}